

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

LY_ERR json_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  char *pcVar3;
  jsonpr_ctx local_78;
  
  local_78.open.field_2.dnodes = (lyd_node **)0x0;
  local_78.first_leaflist = (lyd_node *)0x0;
  local_78.level_printed = 0;
  local_78._42_6_ = 0;
  local_78.open.size = 0;
  local_78.open.count = 0;
  local_78.level = 0;
  local_78._26_2_ = 0;
  local_78.options = 0;
  local_78.ctx = (ly_ctx *)0x0;
  local_78.root = (lyd_node *)0x0;
  local_78.parent = (lyd_node *)0x0;
  pcVar3 = "";
  if ((options & 2) == 0) {
    pcVar3 = "\n";
  }
  if (root == (lyd_node *)0x0) {
    ly_print_(out,"{}%s",pcVar3);
  }
  else {
    local_78.options = options;
    local_78._24_4_ = 1;
    if (root->schema == (lysc_node *)0x0) {
      plVar2 = (lys_module *)&root[2].schema;
    }
    else {
      plVar2 = root->schema->module;
    }
    local_78.ctx = plVar2->ctx;
    local_78.out = out;
    ly_print_(out,"{%s",pcVar3);
    for (; root != (lyd_node *)0x0; root = root->next) {
      local_78.root = root;
      LVar1 = json_print_node(&local_78,root);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if ((options & 1) == 0) break;
    }
    ly_print_(out,"%s}%s",pcVar3,pcVar3);
    if (local_78.open.count != 0) {
      __assert_fail("!pctx.open.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                    ,0x430,
                    "LY_ERR json_print_data(struct ly_out *, const struct lyd_node *, uint32_t)");
    }
    ly_set_erase(&local_78.open,(_func_void_void_ptr *)0x0);
  }
  ly_print_flush(out);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
json_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    const struct lyd_node *node;
    struct jsonpr_ctx pctx = {0};
    const char *delimiter = (options & LYD_PRINT_SHRINK) ? "" : "\n";

    if (!root) {
        ly_print_(out, "{}%s", delimiter);
        ly_print_flush(out);
        return LY_SUCCESS;
    }

    pctx.out = out;
    pctx.parent = NULL;
    pctx.level = 1;
    pctx.level_printed = 0;
    pctx.options = options;
    pctx.ctx = LYD_CTX(root);

    /* start */
    ly_print_(pctx.out, "{%s", delimiter);

    /* content */
    LY_LIST_FOR(root, node) {
        pctx.root = node;
        LY_CHECK_RET(json_print_node(&pctx, node));
        if (!(options & LYD_PRINT_WITHSIBLINGS)) {
            break;
        }
    }

    /* end */
    ly_print_(out, "%s}%s", delimiter, delimiter);

    assert(!pctx.open.count);
    ly_set_erase(&pctx.open, NULL);

    ly_print_flush(out);
    return LY_SUCCESS;
}